

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# katajainen.c
# Opt level: O1

void BoundaryPM(Node *(*lists) [2],Node *leaves,int numsymbols,NodePool *pool,int index)

{
  int iVar1;
  Node *pNVar2;
  Node *pNVar3;
  Node *pNVar4;
  int index_00;
  ulong uVar5;
  Node **ppNVar6;
  
  index_00 = index + -1;
  ppNVar6 = lists[index] + 1;
  while( true ) {
    iVar1 = (*ppNVar6)->count;
    if ((index_00 == -1) && (numsymbols <= iVar1)) {
      return;
    }
    pNVar2 = pool->next;
    pool->next = pNVar2 + 1;
    pNVar3 = *ppNVar6;
    (*(Node *(*) [2])(ppNVar6 + -1))[0] = pNVar3;
    *ppNVar6 = pNVar2;
    if (index_00 == -1) {
      pNVar2->weight = leaves[iVar1].weight;
      pNVar2->count = iVar1 + 1;
      pNVar2->tail = (Node *)0x0;
      return;
    }
    pNVar4 = lists[index_00][1];
    uVar5 = pNVar4->weight + lists[index_00][0]->weight;
    if ((iVar1 < numsymbols) && (leaves[iVar1].weight < uVar5)) break;
    pNVar2->weight = uVar5;
    pNVar2->count = iVar1;
    pNVar2->tail = pNVar4;
    BoundaryPM(lists,leaves,numsymbols,pool,index_00);
    index_00 = index_00 + -1;
    ppNVar6 = ppNVar6 + -2;
  }
  pNVar3 = pNVar3->tail;
  pNVar2->weight = leaves[iVar1].weight;
  pNVar2->count = iVar1 + 1;
  pNVar2->tail = pNVar3;
  return;
}

Assistant:

static void BoundaryPM(Node* (*lists)[2], Node* leaves, int numsymbols,
                       NodePool* pool, int index) {
  Node* newchain;
  Node* oldchain;
  int lastcount = lists[index][1]->count;  /* Count of last chain of list. */

  if (index == 0 && lastcount >= numsymbols) return;

  newchain = pool->next++;
  oldchain = lists[index][1];

  /* These are set up before the recursive calls below, so that there is a list
  pointing to the new node, to let the garbage collection know it's in use. */
  lists[index][0] = oldchain;
  lists[index][1] = newchain;

  if (index == 0) {
    /* New leaf node in list 0. */
    InitNode(leaves[lastcount].weight, lastcount + 1, 0, newchain);
  } else {
    size_t sum = lists[index - 1][0]->weight + lists[index - 1][1]->weight;
    if (lastcount < numsymbols && sum > leaves[lastcount].weight) {
      /* New leaf inserted in list, so count is incremented. */
      InitNode(leaves[lastcount].weight, lastcount + 1, oldchain->tail,
          newchain);
    } else {
      InitNode(sum, lastcount, lists[index - 1][1], newchain);
      /* Two lookahead chains of previous list used up, create new ones. */
      BoundaryPM(lists, leaves, numsymbols, pool, index - 1);
      BoundaryPM(lists, leaves, numsymbols, pool, index - 1);
    }
  }
}